

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_scalar_constructors(void)

{
  ostream *poVar1;
  json s;
  json d;
  json i;
  json f;
  json t;
  json null;
  
  std::operator<<((ostream *)jlog,"test_scalar_constructors()\n");
  argo::json::json(&null);
  poVar1 = argo::operator<<((ostream *)jlog,&null);
  std::endl<char,std::char_traits<char>>(poVar1);
  argo::json::json(&t,true);
  poVar1 = argo::operator<<((ostream *)jlog,&t);
  std::endl<char,std::char_traits<char>>(poVar1);
  argo::json::json(&f,false);
  poVar1 = argo::operator<<((ostream *)jlog,&f);
  std::endl<char,std::char_traits<char>>(poVar1);
  argo::json::json(&i,0x7b);
  poVar1 = argo::operator<<((ostream *)jlog,&i);
  std::endl<char,std::char_traits<char>>(poVar1);
  argo::json::json(&d,123.4);
  poVar1 = argo::operator<<((ostream *)jlog,&d);
  std::endl<char,std::char_traits<char>>(poVar1);
  argo::json::json(&s,"asdasd");
  poVar1 = argo::operator<<((ostream *)jlog,&s);
  std::endl<char,std::char_traits<char>>(poVar1);
  argo::json::~json(&s);
  argo::json::~json(&d);
  argo::json::~json(&i);
  argo::json::~json(&f);
  argo::json::~json(&t);
  argo::json::~json(&null);
  return;
}

Assistant:

void test_scalar_constructors()
{
    jlog << "test_scalar_constructors()\n";
    json null;
    jlog << null << endl;
    json t(true);
    jlog << t << endl;
    json f(false);
    jlog << f << endl;
    json i(123);
    jlog << i << endl;
    json d(123.4);
    jlog << d << endl;
    json s("asdasd");
    jlog << s << endl;
}